

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void highsOpenLogFile(HighsLogOptions *log_options,
                     vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                     string *log_file)

{
  OptionRecordString *this;
  int iVar1;
  FILE *pFVar2;
  HighsInt index;
  allocator local_5d;
  int local_5c;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"log_file",&local_5d);
  getOptionIndex(log_options,&local_58,option_records,&local_5c);
  std::__cxx11::string::~string((string *)&local_58);
  if ((FILE *)log_options->log_stream != (FILE *)0x0) {
    fflush((FILE *)log_options->log_stream);
    fclose((FILE *)log_options->log_stream);
  }
  iVar1 = std::__cxx11::string::compare((char *)log_file);
  if (iVar1 == 0) {
    pFVar2 = (FILE *)0x0;
  }
  else {
    pFVar2 = fopen((log_file->_M_dataplus)._M_p,"a");
  }
  log_options->log_stream = (FILE *)pFVar2;
  this = (OptionRecordString *)
         (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
         _M_impl.super__Vector_impl_data._M_start[local_5c];
  std::__cxx11::string::string((string *)&local_38,(string *)log_file);
  OptionRecordString::assignvalue(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void highsOpenLogFile(HighsLogOptions& log_options,
                      std::vector<OptionRecord*>& option_records,
                      const std::string log_file) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(log_options, "log_file", option_records, index);
  assert(status == OptionStatus::kOk);
  if (log_options.log_stream != NULL) {
    // Current log file stream is not null, so flush and close it
    fflush(log_options.log_stream);
    fclose(log_options.log_stream);
  }
  if (log_file.compare("")) {
    // New log file name is not empty, so open it, appending if
    // possible
    log_options.log_stream = fopen(log_file.c_str(), "a");
  } else {
    // New log file name is empty, so set the stream to null
    log_options.log_stream = NULL;
  }
  OptionRecordString& option = *(OptionRecordString*)option_records[index];
  option.assignvalue(log_file);
}